

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int set_int_attr(attr_list list,atom_t attr_id,int ivalue)

{
  attr_union value;
  int iVar1;
  uint in_EDX;
  attr_union tmp;
  attr_value_type t;
  undefined1 in_stack_ffffffffffffffe0 [12];
  
  value.u._12_4_ = 1;
  value.u._0_12_ = in_stack_ffffffffffffffe0;
  iVar1 = set_pattr((attr_list)(ulong)in_EDX,0,0x105993,value);
  return iVar1;
}

Assistant:

extern int
set_int_attr(attr_list list, atom_t attr_id, int ivalue)
{
    attr_value_type t = Attr_Int4;
    attr_union tmp;
    tmp.u.l = 0;
    tmp.u.i = ivalue;
    if (sizeof(int) == 8) t = Attr_Int8;
    return set_pattr(list, attr_id, t, tmp);
}